

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_cursor.c
# Opt level: O1

void ts_tree_cursor_init(TreeCursor *self,TSNode node)

{
  uint uVar1;
  uint32_t uVar2;
  TSPoint TVar3;
  TreeCursorEntry *pTVar4;
  TreeCursor *unaff_RBX;
  TreeCursor *pTVar5;
  
  do {
    *(TreeCursor **)((long)register0x00000020 + -8) = unaff_RBX;
    self->tree = *(TSTree **)((long)register0x00000020 + 0x20);
    (self->stack).size = 0;
    if ((self->stack).capacity != 0) {
LAB_00134010:
      pTVar4 = (self->stack).contents;
      uVar1 = (self->stack).size;
      (self->stack).size = uVar1 + 1;
      uVar2 = *(uint32_t *)((long)register0x00000020 + 8);
      TVar3 = *(TSPoint *)((long)register0x00000020 + 0xc);
      pTVar4[uVar1].subtree = *(Subtree **)((long)register0x00000020 + 0x18);
      pTVar4[uVar1].position.bytes = uVar2;
      pTVar4[uVar1].position.extent = TVar3;
      pTVar4[uVar1].child_index = 0;
      pTVar4[uVar1].structural_child_index = 0;
      return;
    }
    pTVar4 = (self->stack).contents;
    if (pTVar4 != (TreeCursorEntry *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x10) = 0x133fe7;
      pTVar4 = (TreeCursorEntry *)realloc(pTVar4,0x100);
      if (pTVar4 == (TreeCursorEntry *)0x0) {
        *(undefined8 *)((long)register0x00000020 + -0x10) = 0x133ff1;
        ts_tree_cursor_init_cold_1();
        goto LAB_00133ff1;
      }
LAB_00134005:
      (self->stack).contents = pTVar4;
      (self->stack).capacity = 8;
      goto LAB_00134010;
    }
LAB_00133ff1:
    pTVar5 = (TreeCursor *)0x8;
    *(undefined8 *)((long)register0x00000020 + -0x10) = 0x134000;
    pTVar4 = (TreeCursorEntry *)calloc(8,0x20);
    if (pTVar4 != (TreeCursorEntry *)0x0) goto LAB_00134005;
    *(code **)((long)register0x00000020 + -0x10) = ts_tree_cursor_reset;
    ts_tree_cursor_init_cold_2();
    unaff_RBX = self;
    register0x00000020 = (BADSPACEBASE *)((long)register0x00000020 + -8);
    self = pTVar5;
  } while( true );
}

Assistant:

void ts_tree_cursor_init(TreeCursor *self, TSNode node) {
  self->tree = node.tree;
  array_clear(&self->stack);
  array_push(&self->stack, ((TreeCursorEntry) {
    .subtree = (const Subtree *)node.id,
    .position = {
      ts_node_start_byte(node),
      ts_node_start_point(node)
    },
    .child_index = 0,
    .structural_child_index = 0,
  }));
}